

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

void __thiscall CVmFormatter::write_blank_line(CVmFormatter *this)

{
  flush(this,VM_NL_NEWLINE);
  if ((this->field_0xef81 & 0x40) != 0) {
    write_text(this,L"<BR>",4,(vmcon_color_t *)0x0,VM_NL_NONE);
  }
  write_text(this,L"",0,(vmcon_color_t *)0x0,VM_NL_NEWLINE);
  return;
}

Assistant:

void CVmFormatter::write_blank_line(VMG0_)
{
    /* flush the stream */
    flush(vmg_ VM_NL_NEWLINE);

    /* if generating for an HTML display target, add an HTML line break */
    if (html_target_)
        write_text(vmg_ L"<BR>", 4, 0, VM_NL_NONE);

    /* write out a blank line */
    write_text(vmg_ L"", 0, 0, VM_NL_NEWLINE);
}